

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_typed_attr<tinyusdz::value::normal3f>
                   (string *__return_storage_ptr__,
                   TypedAttribute<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *attr,
                   string *name,uint32_t indent)

{
  char cVar1;
  Path *v;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  value_type *pvVar6;
  ostream *poVar7;
  long lVar8;
  float indent_00;
  pointer pPVar9;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  char *pcVar10;
  bool bVar11;
  bool bVar12;
  normal3f a;
  stringstream ss;
  undefined1 local_238 [32];
  string *local_218;
  optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> local_210;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar2 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::authored(attr);
  if (!bVar2) goto LAB_002540d3;
  local_218 = __return_storage_ptr__;
  bVar3 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::is_value_empty(attr);
  pPVar9 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar11 = pPVar9 != (attr->_paths).
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_start;
  bVar2 = (attr->_attrib).has_value_;
  nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::optional
            (&local_210,&attr->_attrib);
  if (local_210.has_value_ == true) {
    pvVar6 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::
             value(&local_210);
    cVar1 = pvVar6->_has_value;
  }
  else {
    cVar1 = '\0';
  }
  if ((local_210.has_value_ & 1U) == 0) {
    bVar4 = false;
  }
  else {
    pvVar6 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::
             value(&local_210);
    bVar4 = Animatable<tinyusdz::value::normal3f>::has_timesamples(pvVar6);
  }
  if ((((local_210.has_value_ & 1U) == 0) ||
      (pvVar6 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::
                value(&local_210), pvVar6->_blocked != false)) || (pvVar6->_has_value != false)) {
    bVar12 = false;
  }
  else {
    pPVar9 = (pointer)(pvVar6->_ts)._samples.
                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    bVar12 = pPVar9 != (pointer)(pvVar6->_ts)._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
  }
  indent_00 = SUB84(pPVar9,0);
  bVar5 = AttrMetas::authored(&attr->_metas);
  if (((bVar5) || ((byte)(bVar11 & (bVar2 ^ 1U) | bVar12) != 1)) ||
     (n_01 = n, (bVar3 || attr->_blocked != false) || cVar1 != '\0')) {
    pprint::Indent_abi_cxx11_((string *)local_238,(pprint *)(ulong)indent,n);
    ::std::operator<<(local_1a8,(string *)local_238);
    ::std::__cxx11::string::_M_dispose();
    value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
    poVar7 = ::std::operator<<(local_1a8,(string *)local_238);
    poVar7 = ::std::operator<<(poVar7," ");
    ::std::operator<<(poVar7,(string *)name);
    ::std::__cxx11::string::_M_dispose();
    if (attr->_blocked == true) {
      pcVar10 = " = None";
LAB_00253e82:
      ::std::operator<<(local_1a8,pcVar10);
    }
    else if (cVar1 != '\0') {
      pvVar6 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::
               value(&local_210);
      if ((pvVar6->_blocked != false) || (pvVar6->_has_value != true)) {
        pcVar10 = " = [InternalError]";
        goto LAB_00253e82;
      }
      indent_00 = (pvVar6->_value).z;
      local_238._0_8_ = *(undefined8 *)&pvVar6->_value;
      local_238._8_4_ = indent_00;
      poVar7 = ::std::operator<<(local_1a8," = ");
      ::std::operator<<(poVar7,(normal3f *)local_238);
    }
    bVar2 = AttrMetas::authored(&attr->_metas);
    if (bVar2) {
      poVar7 = ::std::operator<<(local_1a8,"(\n");
      print_attr_metas_abi_cxx11_
                ((string *)local_238,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),
                 (uint32_t)indent_00);
      poVar7 = ::std::operator<<(poVar7,(string *)local_238);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n_00);
      poVar7 = ::std::operator<<(poVar7,(string *)&local_1d8);
      ::std::operator<<(poVar7,")");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::operator<<(local_1a8,"\n");
    n_01 = extraout_EDX;
  }
  if (bVar4 != false) {
    pprint::Indent_abi_cxx11_((string *)local_238,(pprint *)(ulong)indent,n_01);
    ::std::operator<<(local_1a8,(string *)local_238);
    ::std::__cxx11::string::_M_dispose();
    value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
    poVar7 = ::std::operator<<(local_1a8,(string *)local_238);
    poVar7 = ::std::operator<<(poVar7," ");
    ::std::operator<<(poVar7,(string *)name);
    ::std::__cxx11::string::_M_dispose();
    poVar7 = ::std::operator<<(local_1a8,".timeSamples = ");
    pvVar6 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::
             value(&local_210);
    print_typed_timesamples<tinyusdz::value::normal3f>((string *)local_238,&pvVar6->_ts,indent);
    ::std::operator<<(poVar7,(string *)local_238);
    ::std::__cxx11::string::_M_dispose();
    ::std::operator<<(local_1a8,"\n");
    n_01 = extraout_EDX_00;
  }
  __return_storage_ptr__ = local_218;
  if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_((string *)local_238,(pprint *)(ulong)indent,n_01);
    ::std::operator<<(local_1a8,(string *)local_238);
    ::std::__cxx11::string::_M_dispose();
    value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
    poVar7 = ::std::operator<<(local_1a8,(string *)local_238);
    poVar7 = ::std::operator<<(poVar7," ");
    ::std::operator<<(poVar7,(string *)name);
    ::std::__cxx11::string::_M_dispose();
    ::std::operator<<(local_1a8,".connect = ");
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar8 = ((long)(attr->_paths).
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)v) / 0xd0;
    if (lVar8 == 0) {
      ::std::operator<<(local_1a8,"[InternalError]");
    }
    else if (lVar8 == 1) {
      ::std::operator<<(local_1a8,v);
    }
    else {
      ::std::operator<<(local_1a8,&attr->_paths);
    }
    ::std::operator<<(local_1a8,"\n");
  }
  nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::~optional
            (&local_210);
LAB_002540d3:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}